

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalCreateARTIndex::Sink
          (PhysicalCreateARTIndex *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  DataChunk *this_00;
  LocalSinkState *pLVar1;
  idx_t count;
  bool bVar2;
  reference pvVar3;
  ConstraintException *this_01;
  pointer pCVar4;
  ART *this_02;
  ulong __n;
  allocator local_89;
  OperatorSinkInput *local_88;
  PhysicalCreateARTIndex *local_80;
  ArenaAllocator *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pLVar1 = input->local_state;
  local_78 = (ArenaAllocator *)&pLVar1[1].partition_info;
  local_88 = input;
  ArenaAllocator::Reset(local_78);
  this_00 = (DataChunk *)
            &pLVar1[2].partition_info.partition_data.
             super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             .
             super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  DataChunk::ReferenceColumns
            (this_00,chunk,(vector<unsigned_long,_true> *)&pLVar1[4].partition_info.partition_data);
  local_80 = this;
  if ((this->alter_table_info).
      super_unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
      .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl != (AlterTableInfo *)0x0)
  {
    count = pLVar1[3].partition_info.batch_index.index;
    __n = 0;
    while (__n < (ulong)(((long)pLVar1[2].partition_info.partition_data.
                                super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                                .
                                super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)pLVar1[2].partition_info.partition_data.
                               super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                               .
                               super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                               ._M_impl.super__Vector_impl_data._M_finish) / 0x68)) {
      pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_00,__n);
      bVar2 = VectorOperations::HasNull(pvVar3,count);
      __n = __n + 1;
      if (bVar2) {
        this_01 = (ConstraintException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"NOT NULL constraint failed: %s",&local_89);
        pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                 ::operator->(&local_80->info);
        ::std::__cxx11::string::string((string *)&local_70,(string *)&pCVar4->index_name);
        ConstraintException::ConstraintException<std::__cxx11::string>(this_01,&local_50,&local_70);
        __cxa_throw(this_01,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  this_02 = (ART *)unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::
                   operator->((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                               *)(pLVar1 + 1));
  pvVar3 = vector<duckdb::Vector,_true>::get<true>
                     (&chunk->data,
                      ((long)(chunk->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(chunk->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x68 - 1);
  ART::GenerateKeyVectors
            (this_02,local_78,this_00,pvVar3,(unsafe_vector<ARTKey> *)(pLVar1 + 4),
             (unsafe_vector<ARTKey> *)&pLVar1[6].partition_info.min_batch_index);
  if (local_80->sorted == true) {
    SinkSorted(local_80,local_88);
  }
  else {
    SinkUnsorted(local_80,local_88);
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalCreateARTIndex::Sink(ExecutionContext &context, DataChunk &chunk,
                                            OperatorSinkInput &input) const {
	D_ASSERT(chunk.ColumnCount() >= 2);
	auto &l_state = input.local_state.Cast<CreateARTIndexLocalSinkState>();
	l_state.arena_allocator.Reset();
	l_state.key_chunk.ReferenceColumns(chunk, l_state.key_column_ids);

	// Check for NULLs, if we are creating a PRIMARY KEY.
	// FIXME: Later, we want to ensure that we skip the NULL check for any non-PK alter.
	if (alter_table_info) {
		auto row_count = l_state.key_chunk.size();
		for (idx_t i = 0; i < l_state.key_chunk.ColumnCount(); i++) {
			if (VectorOperations::HasNull(l_state.key_chunk.data[i], row_count)) {
				throw ConstraintException("NOT NULL constraint failed: %s", info->index_name);
			}
		}
	}

	l_state.local_index->Cast<ART>().GenerateKeyVectors(
	    l_state.arena_allocator, l_state.key_chunk, chunk.data[chunk.ColumnCount() - 1], l_state.keys, l_state.row_ids);

	if (sorted) {
		return SinkSorted(input);
	}
	return SinkUnsorted(input);
}